

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::multisample::
MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtCentroidConsistency>::initPrograms
          (MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtCentroidConsistency> *this,
          SourceCollections *programCollection)

{
  ostream *poVar1;
  ProgramSources *pPVar2;
  string local_3f8;
  ShaderSource local_3d8;
  allocator<char> local_3a9;
  string local_3a8;
  ostringstream local_388 [8];
  ostringstream fs;
  string local_210;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream vs;
  SourceCollections *programCollection_local;
  MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtCentroidConsistency> *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"#version 440\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in vec4 vs_in_position_ndc;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 1) in vec2 vs_in_position_screen;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out vec2 vs_out_pos_screen_sample;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 1) out vec2 vs_out_pos_screen_centroid;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"out gl_PerVertex {\n");
  poVar1 = std::operator<<(poVar1,"\tvec4  gl_Position;\n");
  poVar1 = std::operator<<(poVar1,"};\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\tgl_Position\t\t\t\t\t= vs_in_position_ndc;\n");
  poVar1 = std::operator<<(poVar1,"\tvs_out_pos_screen_sample\t= vs_in_position_screen;\n");
  poVar1 = std::operator<<(poVar1,"\tvs_out_pos_screen_centroid\t= vs_in_position_screen;\n");
  std::operator<<(poVar1,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"vertex_shader",&local_1c1);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1c0);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_1f0,&local_210);
  glu::ProgramSources::operator<<(pPVar2,&local_1f0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::ostringstream::ostringstream(local_388);
  poVar1 = std::operator<<((ostream *)local_388,"#version 440\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) sample   in vec2 fs_in_pos_screen_sample;\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "layout(location = 1) centroid in vec2 fs_in_pos_screen_centroid;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out vec4 fs_out_color;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\tconst float threshold = 0.0005;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,
                           "\tconst vec2 pos_interpolated_at_centroid = interpolateAtCentroid(fs_in_pos_screen_sample);\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "\tconst bool valuesEqual\t\t\t\t\t= all(lessThan(abs(pos_interpolated_at_centroid - fs_in_pos_screen_centroid), vec2(threshold)));\n"
                          );
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tif (valuesEqual)\n");
  poVar1 = std::operator<<(poVar1,"\t\tfs_out_color = vec4(0.0, 1.0, 0.0, 1.0);\n");
  poVar1 = std::operator<<(poVar1,"\telse\n");
  poVar1 = std::operator<<(poVar1,"\t\tfs_out_color = vec4(1.0, 0.0, 0.0, 1.0);\n");
  std::operator<<(poVar1,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"fragment_shader",&local_3a9);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_3a8);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_3d8,&local_3f8);
  glu::ProgramSources::operator<<(pPVar2,&local_3d8);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::__cxx11::ostringstream::~ostringstream(local_388);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void MSCase<MSCaseInterpolateAtCentroidConsistency>::initPrograms (vk::SourceCollections& programCollection) const
{
	// Create vertex shader
	std::ostringstream vs;

	vs << "#version 440\n"
		<< "layout(location = 0) in vec4 vs_in_position_ndc;\n"
		<< "layout(location = 1) in vec2 vs_in_position_screen;\n"
		<< "\n"
		<< "layout(location = 0) out vec2 vs_out_pos_screen_sample;\n"
		<< "layout(location = 1) out vec2 vs_out_pos_screen_centroid;\n"
		<< "\n"
		<< "out gl_PerVertex {\n"
		<< "	vec4  gl_Position;\n"
		<< "};\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position					= vs_in_position_ndc;\n"
		<< "	vs_out_pos_screen_sample	= vs_in_position_screen;\n"
		<< "	vs_out_pos_screen_centroid	= vs_in_position_screen;\n"
		<< "}\n";

	programCollection.glslSources.add("vertex_shader") << glu::VertexSource(vs.str());

	// Create fragment shader
	std::ostringstream fs;

	fs << "#version 440\n"
		<< "layout(location = 0) sample   in vec2 fs_in_pos_screen_sample;\n"
		<< "layout(location = 1) centroid in vec2 fs_in_pos_screen_centroid;\n"
		<< "\n"
		<< "layout(location = 0) out vec4 fs_out_color;\n"
		<< "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	const float threshold = 0.0005;\n"
		<< "\n"
		<< "	const vec2 pos_interpolated_at_centroid = interpolateAtCentroid(fs_in_pos_screen_sample);\n"
		<< "	const bool valuesEqual					= all(lessThan(abs(pos_interpolated_at_centroid - fs_in_pos_screen_centroid), vec2(threshold)));\n"
		<< "\n"
		<< "	if (valuesEqual)\n"
		<< "		fs_out_color = vec4(0.0, 1.0, 0.0, 1.0);\n"
		<< "	else\n"
		<< "		fs_out_color = vec4(1.0, 0.0, 0.0, 1.0);\n"
		<< "}\n";

	programCollection.glslSources.add("fragment_shader") << glu::FragmentSource(fs.str());
}